

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quuid.h
# Opt level: O2

Variant __thiscall QUuid::variant(QUuid *this)

{
  byte bVar1;
  bool bVar2;
  
  bVar1 = this->data4[0];
  if (-1 < (char)bVar1) {
    bVar2 = isNull();
    return -(uint)bVar2;
  }
  if (bVar1 < 0xc0) {
    return DCE;
  }
  return (uint)(bVar1 >> 5);
}

Assistant:

constexpr Variant variant(QT6_DECL_NEW_OVERLOAD) const noexcept
    {
        // Check the 3 MSB of data4[0]
        const quint8 var = data4[0] & 0xE0;
        if (var < 0x80)
            return isNull(QT6_CALL_NEW_OVERLOAD) ? VarUnknown : NCS;
        if (var < 0xC0)
            return DCE;
        return Variant(var >> 5); // Microsoft or Reserved
    }